

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  ImVec4 *pIVar1;
  undefined8 *puVar2;
  float text_offset_y;
  ImGuiCond IVar3;
  int iVar4;
  ImDrawList *this;
  ImVec2 pos;
  ImVec2 IVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  bool bVar13;
  ImGuiID IVar14;
  ImU32 IVar15;
  ImGuiWindow *pIVar16;
  ImGuiWindow *pIVar17;
  ImGuiContext *g;
  ImGuiStorage *this_00;
  uint uVar18;
  float fVar19;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar20;
  float fVar21;
  bool hovered;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImRect r_outer;
  ImVec2 size_expected;
  ImRect value_bb;
  ImVec2 size_contents;
  ImRect total_bb;
  bool local_f2;
  char local_f1;
  float local_f0;
  bool local_e9;
  ImRect local_e8;
  ImGuiID local_d0;
  ImGuiCond local_cc;
  ImVec4 local_c8;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ImRect local_a0;
  char *local_90;
  char *local_88;
  ImVec2 local_80;
  undefined1 local_78 [24];
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar11 = GImGui;
  IVar3 = (GImGui->NextWindowData).SizeConstraintCond;
  (GImGui->NextWindowData).SizeConstraintCond = 0;
  pIVar16 = pIVar11->CurrentWindow;
  pIVar16->WriteAccessed = true;
  if (pIVar16->SkipItems == false) {
    local_88 = preview_value;
    if ((~flags & 0x60U) == 0) {
      __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2aee,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    IVar14 = ImGuiWindow::GetID(pIVar16,label,(char *)0x0);
    local_f0 = 0.0;
    if ((flags & 0x20U) == 0) {
      fVar19 = (GImGui->Style).FramePadding.y;
      local_f0 = fVar19 + fVar19 + GImGui->FontSize;
    }
    IVar5 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uStack_b4 = 0;
    uStack_b0 = 0;
    uStack_ac = 0;
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_4_ = IVar5.x;
    local_78._4_4_ = IVar5.y;
    local_78._12_4_ = extraout_XMM0_Dd;
    local_b8 = local_f0;
    fVar19 = IVar5.x;
    fVar20 = IVar5.y;
    if ((flags & 0x40U) == 0) {
      local_b8 = CalcItemWidth();
      uStack_b4 = extraout_XMM0_Db;
      uStack_b0 = extraout_XMM0_Dc_00;
      uStack_ac = extraout_XMM0_Dd_00;
      fVar19 = (float)local_78._0_4_;
      fVar20 = (float)local_78._4_4_;
    }
    text_offset_y = (pIVar11->Style).FramePadding.y;
    local_e8.Max.x = (pIVar16->DC).CursorPos.x + local_b8;
    fVar20 = text_offset_y + text_offset_y + fVar20 + (pIVar16->DC).CursorPos.y;
    local_e8.Max.y = fVar20;
    local_e8.Min = (pIVar16->DC).CursorPos;
    fVar21 = 0.0;
    if (0.0 < fVar19) {
      fVar21 = (pIVar11->Style).ItemInnerSpacing.x + fVar19;
    }
    fVar20 = fVar20 + 0.0;
    local_40.Max.y = fVar20;
    local_40.Max.x = fVar21 + local_e8.Max.x;
    local_40.Min.x = local_e8.Min.x;
    local_c8.x = (fVar21 + local_e8.Max.x) - local_40.Min.x;
    local_40.Min.y = local_e8.Min.y;
    local_c8.y = fVar20 - local_40.Min.y;
    local_d0 = IVar14;
    local_90 = label;
    local_40.Min = local_e8.Min;
    ItemSize((ImVec2 *)&local_c8,text_offset_y);
    IVar14 = local_d0;
    bVar12 = ItemAdd(&local_40,local_d0,&local_e8);
    if (bVar12) {
      bVar12 = false;
      local_cc = IVar3;
      local_f1 = ButtonBehavior(&local_e8,IVar14,&local_f2,&local_e9,0);
      iVar4 = (GImGui->CurrentPopupStack).Size;
      if (iVar4 < (GImGui->OpenPopupStack).Size) {
        bVar12 = (GImGui->OpenPopupStack).Data[iVar4].PopupId == IVar14;
      }
      local_60 = local_e8.Min;
      local_58.y = local_e8.Max.y;
      local_58.x = local_e8.Max.x - local_f0;
      pIVar1 = (GImGui->Style).Colors + (ulong)local_f2 + 7;
      local_c8.x = pIVar1->x;
      local_c8.y = pIVar1->y;
      uVar6 = pIVar1->z;
      uVar7 = pIVar1->w;
      local_c8.w = (GImGui->Style).Alpha * (float)uVar7;
      local_c8.z = (float)uVar6;
      IVar15 = ColorConvertFloat4ToU32(&local_c8);
      RenderNavHighlight(&local_e8,IVar14,1);
      if ((flags & 0x40U) == 0) {
        local_c8.y = local_e8.Max.y;
        local_c8.x = local_e8.Max.x - local_f0;
        ImDrawList::AddRectFilled
                  (pIVar16->DrawList,&local_e8.Min,(ImVec2 *)&local_c8,IVar15,
                   (pIVar11->Style).FrameRounding,5);
      }
      if ((flags & 0x20U) == 0) {
        this = pIVar16->DrawList;
        local_a0.Min.y = local_e8.Min.y;
        local_a0.Min.x = local_e8.Max.x - local_f0;
        puVar2 = (undefined8 *)
                 ((long)&(GImGui->Style).Colors[0x15].x +
                 (ulong)(((byte)(local_f2 | bVar12) & 1) << 4));
        local_c8._0_8_ = *puVar2;
        uVar8 = puVar2[1];
        local_c8.w = (float)((ulong)uVar8 >> 0x20);
        local_c8.z = (float)uVar8;
        local_c8.w = (GImGui->Style).Alpha * local_c8.w;
        IVar15 = ColorConvertFloat4ToU32(&local_c8);
        ImDrawList::AddRectFilled
                  (this,&local_a0.Min,&local_e8.Max,IVar15,(pIVar11->Style).FrameRounding,
                   (uint)(local_b8 <= local_f0) * 5 + 10);
        fVar19 = (pIVar11->Style).FramePadding.y;
        IVar5.y = fVar19 + local_e8.Min.y;
        IVar5.x = (local_e8.Max.x - local_f0) + fVar19;
        RenderArrow(IVar5,3,1.0);
      }
      RenderFrameBorder(local_e8.Min,local_e8.Max,(pIVar11->Style).FrameRounding);
      if (local_88 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
        local_c8.y = local_e8.Min.y + (pIVar11->Style).FramePadding.y;
        local_c8.x = local_e8.Min.x + (pIVar11->Style).FramePadding.x;
        auVar9._8_8_ = 0;
        auVar9._0_4_ = local_a0.Max.x;
        auVar9._4_4_ = local_a0.Max.y;
        local_a0 = (ImRect)(auVar9 << 0x40);
        RenderTextClipped((ImVec2 *)&local_c8,&local_58,local_88,(char *)0x0,(ImVec2 *)0x0,
                          &local_a0.Min,(ImRect *)0x0);
      }
      IVar3 = local_cc;
      IVar14 = local_d0;
      if (0.0 < (float)local_78._0_4_) {
        pos.y = local_e8.Min.y + (pIVar11->Style).FramePadding.y;
        pos.x = local_e8.Max.x + (pIVar11->Style).ItemInnerSpacing.x;
        RenderText(pos,local_90,(char *)0x0,true);
      }
      bVar13 = bVar12;
      if (local_f1 == '\0') {
        bVar13 = (bool)(pIVar11->NavActivateId != IVar14 | bVar12);
      }
      if (bVar13 == false) {
        if ((pIVar16->DC).NavLayerCurrent == 0) {
          pIVar16->NavLastIds[0] = IVar14;
        }
        OpenPopupEx(IVar14);
        bVar12 = true;
      }
      pIVar10 = GImGui;
      if (bVar12 == false) {
        return false;
      }
      if (IVar3 == 0) {
        uVar18 = flags | 4;
        if ((flags & 0x1eU) != 0) {
          uVar18 = flags;
        }
        flags = uVar18;
        uVar18 = (flags & 0x1eU) - 1;
        if ((flags & 0x1eU ^ uVar18) <= uVar18) {
          __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                        ,0x2b24,
                        "bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
        }
        uVar18 = 8;
        if (((flags & 4U) == 0) && (uVar18 = 4, (flags & 2U) == 0)) {
          uVar18 = -(uint)((flags & 8U) == 0) | 0x14;
        }
        if ((int)uVar18 < 1) {
          fVar19 = 3.4028235e+38;
        }
        else {
          fVar19 = (GImGui->Style).WindowPadding.y;
          fVar20 = (GImGui->Style).ItemSpacing.y;
          fVar19 = fVar19 + fVar19 + ((float)(int)uVar18 * (GImGui->FontSize + fVar20) - fVar20);
        }
        (GImGui->NextWindowData).SizeConstraintCond = 1;
        (pIVar10->NextWindowData).SizeConstraintRect.Min.x = local_b8;
        *(undefined8 *)&(pIVar10->NextWindowData).SizeConstraintRect.Min.y = 0x7f7fffff00000000;
        (pIVar10->NextWindowData).SizeConstraintRect.Max.y = fVar19;
        (pIVar10->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
        (pIVar10->NextWindowData).SizeCallbackUserData = (void *)0x0;
      }
      else {
        (pIVar11->NextWindowData).SizeConstraintCond = IVar3;
        fVar19 = (pIVar11->NextWindowData).SizeConstraintRect.Min.x;
        uVar18 = -(uint)(local_b8 <= fVar19);
        (pIVar11->NextWindowData).SizeConstraintRect.Min.x =
             (float)(~uVar18 & (uint)local_b8 | (uint)fVar19 & uVar18);
      }
      ImFormatString((char *)&local_c8,0x10,"##Combo_%02d",
                     (ulong)(uint)(pIVar11->CurrentPopupStack).Size);
      this_00 = &GImGui->WindowsById;
      IVar15 = ImHash(&local_c8,0,0);
      pIVar16 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(this_00,IVar15);
      if ((pIVar16 != (ImGuiWindow *)0x0) && (pIVar16->WasActive == true)) {
        local_48 = CalcSizeContents(pIVar16);
        IVar5 = CalcSizeAutoFit(pIVar16,&local_48);
        pIVar17 = pIVar16;
        local_80 = CalcSizeAfterConstraint(pIVar16,IVar5);
        if ((flags & 1U) != 0) {
          pIVar16->AutoPosLastDirection = 0;
        }
        local_a0 = FindAllowedExtentRectForWindow(pIVar17);
        local_50.y = local_e8.Max.y;
        local_50.x = local_e8.Min.x;
        IVar5 = FindBestWindowPosForPopupEx
                          (&local_50,&local_80,&pIVar16->AutoPosLastDirection,&local_a0,&local_e8,
                           ImGuiPopupPositionPolicy_ComboBox);
        pIVar10 = GImGui;
        (GImGui->NextWindowData).PosVal = IVar5;
        (pIVar10->NextWindowData).PosPivotVal.x = 0.0;
        (pIVar10->NextWindowData).PosPivotVal.y = 0.0;
        (pIVar10->NextWindowData).PosCond = 1;
      }
      local_a0.Min.y = (pIVar11->Style).WindowPadding.y;
      local_a0.Min.x = (pIVar11->Style).FramePadding.x;
      PushStyleVar(1,&local_a0.Min);
      bVar13 = Begin((char *)&local_c8,(bool *)0x0,0x4000143);
      PopStyleVar(1);
      if (bVar13) {
        return bVar12;
      }
      EndPopup();
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2b44,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    ImGuiCond backup_next_window_size_constraint = g.NextWindowData.SizeConstraintCond;
    g.NextWindowData.SizeConstraintCond = 0;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImRect value_bb(frame_bb.Min, frame_bb.Max - ImVec2(arrow_size, 0.0f));
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Max.y), frame_col, style.FrameRounding, ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        window->DrawList->AddRectFilled(ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Min.y), frame_bb.Max, GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button), style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        RenderArrow(ImVec2(frame_bb.Max.x - arrow_size + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), ImGuiDir_Down);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, value_bb.Max, preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (backup_next_window_size_constraint)
    {
        g.NextWindowData.SizeConstraintCond = backup_next_window_size_constraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.CurrentPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_contents = CalcSizeContents(popup_window);
            ImVec2 size_expected = CalcSizeAfterConstraint(popup_window, CalcSizeAutoFit(popup_window, size_contents));
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = FindAllowedExtentRectForWindow(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // Horizontally align ourselves with the framed text
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}